

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed_features.c
# Opt level: O0

void set_good_speed_features_lc_dec_framesize_dependent(AV1_COMP *cpi,SPEED_FEATURES *sf,int speed)

{
  FRAME_UPDATE_TYPE FVar1;
  int in_EDX;
  long in_RSI;
  long *in_RDI;
  bool bVar2;
  int leaf_and_overlay_frames;
  int short_dimension;
  FRAME_UPDATE_TYPE update_type;
  int is_608p_or_larger;
  AV1_COMMON *cm;
  int local_3c;
  int local_34;
  
  if ((0 < in_EDX) && (in_EDX < 4)) {
    if ((int)in_RDI[0x77f7] < *(int *)((long)in_RDI + 0x3bfbc)) {
      local_34 = (int)in_RDI[0x77f7];
    }
    else {
      local_34 = *(int *)((long)in_RDI + 0x3bfbc);
    }
    FVar1 = get_frame_update_type((GF_GROUP *)(*in_RDI + 400),(uint)*(byte *)(in_RDI + 0xe258));
    if (0x25f < local_34) {
      bVar2 = false;
      if ((FVar1 != '\x04') && (bVar2 = false, FVar1 != '\x05')) {
        bVar2 = 1 < *(uint *)((long)in_RDI + 0x3bf8c);
      }
      *(uint *)(in_RSI + 0x3a0) = (uint)bVar2;
    }
    if ((int)in_RDI[0x77f7] < *(int *)((long)in_RDI + 0x3bfbc)) {
      local_3c = (int)in_RDI[0x77f7];
    }
    else {
      local_3c = *(int *)((long)in_RDI + 0x3bfbc);
    }
    if ((local_3c < 0x1e1) || (0x2cf < local_3c)) {
      if (0x25f < local_34) {
        *(undefined4 *)(in_RSI + 0x88) = 1;
      }
    }
    else {
      bVar2 = true;
      if ((FVar1 != '\x01') && (bVar2 = true, FVar1 != '\x04')) {
        bVar2 = FVar1 == '\x05';
      }
      if (bVar2) {
        *(undefined1 *)(in_RSI + 0x70) = 4;
      }
      *(undefined4 *)(in_RSI + 0x30) = 1;
    }
  }
  return;
}

Assistant:

static void set_good_speed_features_lc_dec_framesize_dependent(
    const AV1_COMP *const cpi, SPEED_FEATURES *const sf, int speed) {
  if (speed < 1 || speed > 3) return;

  const AV1_COMMON *const cm = &cpi->common;
  const int is_608p_or_larger = AOMMIN(cm->width, cm->height) >= 608;
  const FRAME_UPDATE_TYPE update_type =
      get_frame_update_type(&cpi->ppi->gf_group, cpi->gf_frame_index);

  if (is_608p_or_larger) {
    sf->lpf_sf.skip_loop_filter_using_filt_error =
        (update_type != OVERLAY_UPDATE && update_type != INTNL_OVERLAY_UPDATE &&
         cpi->common.current_frame.pyramid_level > 1)
            ? 1
            : 0;
  }

  const int short_dimension = AOMMIN(cm->width, cm->height);
  if (short_dimension > 480 && short_dimension < 720) {
    const int leaf_and_overlay_frames =
        (update_type == LF_UPDATE || update_type == OVERLAY_UPDATE ||
         update_type == INTNL_OVERLAY_UPDATE);
    if (leaf_and_overlay_frames) sf->gm_sf.gm_search_type = GM_DISABLE_SEARCH;

    sf->hl_sf.disable_ref_frame_mvs = 1;
  } else if (is_608p_or_larger) {
    sf->gm_sf.gm_erroradv_tr_level = 1;
  }
}